

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall enact::Lexer::~Lexer(Lexer *this)

{
  Lexer *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>_>
  ::~unordered_map(&this->m_keywords);
  Token::~Token(&this->m_last);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Lexer() = default;